

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_serial.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  long global_length;
  N_Vector W;
  N_Vector X;
  N_Vector Y;
  N_Vector Z;
  N_Vector X_00;
  N_Vector X_01;
  uint uVar47;
  char *pcVar48;
  
  if (argc < 3) {
    pcVar48 = "ERROR: TWO (2) Inputs required: vector length, print timing ";
  }
  else {
    global_length = atol(argv[1]);
    if (0 < global_length) {
      iVar1 = atoi(argv[2]);
      SetTiming(iVar1,0);
      puts("Testing serial N_Vector ");
      printf("Vector length %ld \n");
      W = (N_Vector)N_VNewEmpty_Serial(global_length);
      if (W == (N_Vector)0x0) {
        pcVar48 = "FAIL: Unable to create a new empty vector \n";
      }
      else {
        X = (N_Vector)N_VNew_Serial(global_length);
        if (X != (N_Vector)0x0) {
          iVar1 = Test_N_VGetVectorID(X,SUNDIALS_NVEC_SERIAL,0);
          iVar2 = Test_N_VCloneEmpty(X,0);
          iVar3 = Test_N_VClone(X,global_length,0);
          iVar4 = Test_N_VCloneEmptyVectorArray(5,X,0);
          iVar5 = Test_N_VCloneVectorArray(5,X,global_length,0);
          iVar6 = Test_N_VSetArrayPointer(W,global_length,0);
          iVar7 = Test_N_VGetArrayPointer(X,global_length,0);
          Y = N_VClone(X);
          if (Y == (N_Vector)0x0) {
            N_VDestroy(W);
            W = X;
          }
          else {
            Z = N_VClone(X);
            if (Z == (N_Vector)0x0) {
              N_VDestroy(W);
              N_VDestroy(X);
              W = Y;
            }
            else {
              puts("\nTesting standard vector operations:\n");
              iVar8 = Test_N_VConst(X,global_length,0);
              iVar9 = Test_N_VLinearSum(X,Y,Z,global_length,0);
              iVar10 = Test_N_VProd(X,Y,Z,global_length,0);
              iVar11 = Test_N_VDiv(X,Y,Z,global_length,0);
              iVar12 = Test_N_VScale(X,Z,global_length,0);
              iVar13 = Test_N_VAbs(X,Z,global_length,0);
              iVar14 = Test_N_VInv(X,Z,global_length,0);
              iVar15 = Test_N_VAddConst(X,Z,global_length,0);
              iVar16 = Test_N_VDotProd(X,Y,global_length,global_length,0);
              iVar17 = Test_N_VMaxNorm(X,global_length,0);
              iVar18 = Test_N_VWrmsNorm(X,Y,global_length,0);
              iVar19 = Test_N_VWrmsNormMask(X,Y,Z,global_length,global_length,0);
              iVar20 = Test_N_VMin(X,global_length,0);
              iVar21 = Test_N_VWL2Norm(X,Y,global_length,global_length,0);
              iVar22 = Test_N_VL1Norm(X,global_length,global_length,0);
              iVar23 = Test_N_VCompare(X,Z,global_length,0);
              iVar24 = Test_N_VInvTest(X,Z,global_length,0);
              iVar25 = Test_N_VConstrMask(X,Y,Z,global_length,0);
              iVar26 = Test_N_VMinQuotient(X,Y,global_length,0);
              puts("\nTesting fused and vector array operations (disabled):\n");
              X_00 = (N_Vector)N_VNew_Serial(global_length);
              iVar27 = N_VEnableFusedOps_Serial(X_00,0);
              if ((X_00 != (N_Vector)0x0) && (iVar27 == 0)) {
                iVar27 = Test_N_VLinearCombination(X_00,global_length,0);
                iVar28 = Test_N_VScaleAddMulti(X_00,global_length,0);
                iVar29 = Test_N_VDotProdMulti(X_00,global_length,global_length,0);
                iVar30 = Test_N_VLinearSumVectorArray(X_00,global_length,0);
                iVar31 = Test_N_VScaleVectorArray(X_00,global_length,0);
                iVar32 = Test_N_VConstVectorArray(X_00,global_length,0);
                iVar33 = Test_N_VWrmsNormVectorArray(X_00,global_length,0);
                iVar34 = Test_N_VWrmsNormMaskVectorArray(X_00,global_length,global_length,0);
                iVar35 = Test_N_VScaleAddMultiVectorArray(X_00,global_length,0);
                iVar36 = Test_N_VLinearCombinationVectorArray(X_00,global_length,0);
                puts("\nTesting fused and vector array operations (enabled):\n");
                X_01 = (N_Vector)N_VNew_Serial(global_length);
                iVar37 = N_VEnableFusedOps_Serial(X_01,1);
                if ((X_01 != (N_Vector)0x0) && (iVar37 == 0)) {
                  iVar37 = Test_N_VLinearCombination(X_01,global_length,0);
                  iVar38 = Test_N_VScaleAddMulti(X_01,global_length,0);
                  iVar39 = Test_N_VDotProdMulti(X_01,global_length,global_length,0);
                  iVar40 = Test_N_VLinearSumVectorArray(X_01,global_length,0);
                  iVar41 = Test_N_VScaleVectorArray(X_01,global_length,0);
                  iVar42 = Test_N_VConstVectorArray(X_01,global_length,0);
                  iVar43 = Test_N_VWrmsNormVectorArray(X_01,global_length,0);
                  iVar44 = Test_N_VWrmsNormMaskVectorArray(X_01,global_length,global_length,0);
                  iVar45 = Test_N_VScaleAddMultiVectorArray(X_01,global_length,0);
                  iVar46 = Test_N_VLinearCombinationVectorArray(X_01,global_length,0);
                  N_VDestroy(W);
                  N_VDestroy(X);
                  N_VDestroy(Y);
                  N_VDestroy(Z);
                  N_VDestroy(X_00);
                  N_VDestroy(X_01);
                  uVar47 = iVar46 + iVar45 + iVar44 + iVar43 + iVar42 + iVar41 + iVar40 +
                                    iVar39 + iVar38 + iVar37 + iVar31 + iVar32 + iVar33 + iVar34 +
                                                               iVar35 + iVar36 +
                                    iVar24 + iVar25 + iVar26 + iVar27 + iVar28 + iVar29 + iVar30 +
                                    iVar18 + iVar19 + iVar20 + iVar21 + iVar22 + iVar23 +
                                    iVar13 + iVar14 + iVar15 + iVar16 + iVar17 +
                                    iVar9 + iVar10 + iVar11 + iVar12 +
                                    iVar5 + iVar6 + iVar7 + iVar3 + iVar4 + iVar2 + iVar1 + iVar8;
                  if (uVar47 != 0) {
                    printf("FAIL: NVector module failed %i tests \n\n",(ulong)uVar47);
                    return uVar47;
                  }
                  puts("SUCCESS: NVector module passed all tests \n");
                  return 0;
                }
                N_VDestroy(W);
                N_VDestroy(X);
                N_VDestroy(Y);
                N_VDestroy(Z);
                N_VDestroy(X_00);
                puts("FAIL: Unable to create a new vector \n");
                return 1;
              }
              N_VDestroy(W);
              N_VDestroy(X);
              N_VDestroy(Y);
              W = Z;
            }
          }
        }
        N_VDestroy(W);
        pcVar48 = "FAIL: Unable to create a new vector \n";
      }
      puts(pcVar48);
      return 1;
    }
    pcVar48 = "ERROR: length of vector must be a positive integer ";
  }
  puts(pcVar48);
  return -1;
}

Assistant:

int main(int argc, char *argv[])
{
  int          fails = 0;         /* counter for test failures */
  int          retval;            /* function return value     */
  sunindextype length;            /* vector length             */
  N_Vector     U, V, W, X, Y, Z;  /* test vectors              */
  int          print_timing;      /* turn timing on/off        */


  /* check input and set vector length */
  if (argc < 3){
    printf("ERROR: TWO (2) Inputs required: vector length, print timing \n");
    return(-1);
  }

  length = atol(argv[1]);
  if (length <= 0) {
    printf("ERROR: length of vector must be a positive integer \n");
    return(-1); 
  }

  print_timing = atoi(argv[2]);
  SetTiming(print_timing, 0);

  printf("Testing serial N_Vector \n");
  printf("Vector length %ld \n", (long int) length);

  /* Create new vectors */
  W = N_VNewEmpty_Serial(length);
  if (W == NULL) {
    printf("FAIL: Unable to create a new empty vector \n\n");
    return(1);
  }

  X = N_VNew_Serial(length);
  if (X == NULL) {
    N_VDestroy(W);
    printf("FAIL: Unable to create a new vector \n\n");
    return(1);
  }

  /* Check vector ID */
  fails += Test_N_VGetVectorID(X, SUNDIALS_NVEC_SERIAL, 0);

  /* Test clone functions */
  fails += Test_N_VCloneEmpty(X, 0);
  fails += Test_N_VClone(X, length, 0);
  fails += Test_N_VCloneEmptyVectorArray(5, X, 0);
  fails += Test_N_VCloneVectorArray(5, X, length, 0);

  /* Test setting/getting array data */
  fails += Test_N_VSetArrayPointer(W, length, 0);
  fails += Test_N_VGetArrayPointer(X, length, 0);

  /* Clone additional vectors for testing */
  Y = N_VClone(X);
  if (Y == NULL) {
    N_VDestroy(W);
    N_VDestroy(X);
    printf("FAIL: Unable to create a new vector \n\n");
    return(1);
  }

  Z = N_VClone(X);
  if (Z == NULL) {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    printf("FAIL: Unable to create a new vector \n\n");
    return(1);
  }

  /* Standard vector operation tests */
  printf("\nTesting standard vector operations:\n\n");

  fails += Test_N_VConst(X, length, 0);
  fails += Test_N_VLinearSum(X, Y, Z, length, 0);
  fails += Test_N_VProd(X, Y, Z, length, 0);
  fails += Test_N_VDiv(X, Y, Z, length, 0);
  fails += Test_N_VScale(X, Z, length, 0);
  fails += Test_N_VAbs(X, Z, length, 0);
  fails += Test_N_VInv(X, Z, length, 0);
  fails += Test_N_VAddConst(X, Z, length, 0);
  fails += Test_N_VDotProd(X, Y, length, length, 0);
  fails += Test_N_VMaxNorm(X, length, 0);
  fails += Test_N_VWrmsNorm(X, Y, length, 0);
  fails += Test_N_VWrmsNormMask(X, Y, Z, length, length, 0);
  fails += Test_N_VMin(X, length, 0);
  fails += Test_N_VWL2Norm(X, Y, length, length, 0);
  fails += Test_N_VL1Norm(X, length, length, 0);
  fails += Test_N_VCompare(X, Z, length, 0);
  fails += Test_N_VInvTest(X, Z, length, 0);
  fails += Test_N_VConstrMask(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotient(X, Y, length, 0);

  /* Fused and vector array operations tests (disabled) */
  printf("\nTesting fused and vector array operations (disabled):\n\n");

  /* create vector and disable all fused and vector array operations */
  U = N_VNew_Serial(length);
  retval = N_VEnableFusedOps_Serial(U, SUNFALSE);
  if (U == NULL || retval != 0) {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    printf("FAIL: Unable to create a new vector \n\n");
    return(1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(U, length, 0);
  fails += Test_N_VScaleAddMulti(U, length, 0);
  fails += Test_N_VDotProdMulti(U, length, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(U, length, 0);
  fails += Test_N_VScaleVectorArray(U, length, 0);
  fails += Test_N_VConstVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(U, length, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(U, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(U, length, 0);

  /* Fused and vector array operations tests (enabled) */
  printf("\nTesting fused and vector array operations (enabled):\n\n");

  /* create vector and enable all fused and vector array operations */
  V = N_VNew_Serial(length);
  retval = N_VEnableFusedOps_Serial(V, SUNTRUE);
  if (V == NULL || retval != 0) {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    N_VDestroy(U);
    printf("FAIL: Unable to create a new vector \n\n");
    return(1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(V, length, 0);
  fails += Test_N_VScaleAddMulti(V, length, 0);
  fails += Test_N_VDotProdMulti(V, length, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(V, length, 0);
  fails += Test_N_VScaleVectorArray(V, length, 0);
  fails += Test_N_VConstVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(V, length, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(V, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(V, length, 0);

  /* Free vectors */
  N_VDestroy(W);
  N_VDestroy(X);
  N_VDestroy(Y);
  N_VDestroy(Z);
  N_VDestroy(U);
  N_VDestroy(V);

  /* Print result */
  if (fails) {
    printf("FAIL: NVector module failed %i tests \n\n", fails);
  } else {
    printf("SUCCESS: NVector module passed all tests \n\n");
  }

  return(fails);
}